

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssw.c
# Opt level: O2

uint32_t * add_cigar(uint32_t *new_cigar,int32_t *p,int32_t *s,uint32_t length,char op)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  
  iVar3 = *p;
  uVar2 = *s;
  if ((int)uVar2 <= iVar3) {
    uVar2 = (int)uVar2 >> 1 | uVar2;
    uVar2 = (int)uVar2 >> 2 | uVar2;
    uVar2 = (int)uVar2 >> 4 | uVar2;
    uVar2 = (int)uVar2 >> 8 | uVar2;
    uVar2 = (int)uVar2 >> 0x10 | uVar2;
    *s = uVar2 + 1;
    new_cigar = (uint32_t *)realloc(new_cigar,(long)(int)uVar2 * 4 + 4);
    iVar3 = *p;
  }
  bVar1 = ""[op];
  *p = iVar3 + 1;
  new_cigar[iVar3] = (uint)bVar1 | length << 4;
  return new_cigar;
}

Assistant:

uint32_t* add_cigar (uint32_t* new_cigar, int32_t* p, int32_t* s, uint32_t length, char op) {
	if ((*p) >= (*s)) {
		++(*s);
		kroundup32(*s);
		new_cigar = (uint32_t*)realloc(new_cigar, (*s)*sizeof(uint32_t));
	}
	new_cigar[(*p) ++] = to_cigar_int(length, op);
	return new_cigar;
}